

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_drawt_pal.cpp
# Opt level: O2

void __thiscall
swrenderer::DrawColumnRt4AddPalCommand::Execute
          (DrawColumnRt4AddPalCommand *this,DrawerThread *thread)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint32_t *puVar4;
  uint32_t *puVar5;
  uint8_t *puVar6;
  uint8_t *puVar7;
  uint8_t *puVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  byte *pbVar13;
  long lVar14;
  
  iVar9 = (this->super_PalRtCommand).yl;
  iVar9 = DrawerThread::count_for_thread(thread,iVar9,((this->super_PalRtCommand).yh - iVar9) + 1);
  if (0 < iVar9) {
    puVar4 = (this->super_PalRtCommand)._srcblend;
    puVar5 = (this->super_PalRtCommand)._destblend;
    iVar1 = (this->super_PalRtCommand).yl;
    iVar10 = DrawerThread::skipped_by_thread(thread,iVar1);
    iVar2 = (this->super_PalRtCommand).sx;
    iVar1 = (&ylookup)[iVar10 + iVar1];
    puVar6 = (this->super_PalRtCommand)._destorg;
    puVar7 = thread->dc_temp;
    iVar11 = DrawerThread::temp_line_for_thread(thread,(this->super_PalRtCommand).yl);
    iVar11 = iVar11 << 2;
    iVar10 = thread->num_cores;
    iVar3 = (this->super_PalRtCommand)._pitch;
    puVar8 = (this->super_PalRtCommand)._colormap;
    pbVar13 = puVar6 + (long)(iVar2 + iVar1) + 3;
    lVar14 = 0;
    do {
      uVar12 = puVar5[pbVar13[-3]] + puVar4[puVar8[puVar7[lVar14 * 4 + (long)iVar11]]] | 0x1f07c1f;
      pbVar13[-3] = RGB32k.All[uVar12 >> 0xf & uVar12];
      uVar12 = puVar5[pbVar13[-2]] + puVar4[puVar8[puVar7[lVar14 * 4 + (long)iVar11 + 1]]] |
               0x1f07c1f;
      pbVar13[-2] = RGB32k.All[uVar12 >> 0xf & uVar12];
      uVar12 = puVar5[pbVar13[-1]] + puVar4[puVar8[puVar7[lVar14 * 4 + (long)iVar11 + 2]]] |
               0x1f07c1f;
      pbVar13[-1] = RGB32k.All[uVar12 >> 0xf & uVar12];
      uVar12 = puVar5[*pbVar13] + puVar4[puVar8[puVar7[lVar14 * 4 + (long)iVar11 + 3]]] | 0x1f07c1f;
      *pbVar13 = RGB32k.All[uVar12 >> 0xf & uVar12];
      lVar14 = lVar14 + 1;
      pbVar13 = pbVar13 + iVar10 * iVar3;
    } while (iVar9 != (int)lVar14);
  }
  return;
}

Assistant:

void DrawColumnRt4AddPalCommand::Execute(DrawerThread *thread)
	{
		const uint8_t *colormap;
		uint8_t *source;
		uint8_t *dest;
		int pitch;

		int count = yh - yl + 1;
		count = thread->count_for_thread(yl, count);
		if (count <= 0)
			return;

		const uint32_t *fg2rgb = _srcblend;
		const uint32_t *bg2rgb = _destblend;
		dest = ylookup[yl + thread->skipped_by_thread(yl)] + sx + _destorg;
		source = &thread->dc_temp[thread->temp_line_for_thread(yl)*4];
		pitch = _pitch * thread->num_cores;
		colormap = _colormap;

		do {
			uint32_t fg = colormap[source[0]];
			uint32_t bg = dest[0];
			fg = fg2rgb[fg];
			bg = bg2rgb[bg];
			fg = (fg+bg) | 0x1f07c1f;
			dest[0] = RGB32k.All[fg & (fg>>15)];

			fg = colormap[source[1]];
			bg = dest[1];
			fg = fg2rgb[fg];
			bg = bg2rgb[bg];
			fg = (fg+bg) | 0x1f07c1f;
			dest[1] = RGB32k.All[fg & (fg>>15)];


			fg = colormap[source[2]];
			bg = dest[2];
			fg = fg2rgb[fg];
			bg = bg2rgb[bg];
			fg = (fg+bg) | 0x1f07c1f;
			dest[2] = RGB32k.All[fg & (fg>>15)];

			fg = colormap[source[3]];
			bg = dest[3];
			fg = fg2rgb[fg];
			bg = bg2rgb[bg];
			fg = (fg+bg) | 0x1f07c1f;
			dest[3] = RGB32k.All[fg & (fg>>15)];

			source += 4;
			dest += pitch;
		} while (--count);
	}